

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stream.h
# Opt level: O2

void __thiscall
rapidjson::GenericReader<rapidjson::UTF8<char>,rapidjson::UTF8<char>,rapidjson::CrtAllocator>::
ParseValue<1u,rapidjson::GenericInsituStringStream<rapidjson::UTF8<char>>,rapidjson::GenericDocument<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,rapidjson::CrtAllocator>>
          (GenericReader<rapidjson::UTF8<char>,rapidjson::UTF8<char>,rapidjson::CrtAllocator> *this,
          GenericInsituStringStream<rapidjson::UTF8<char>_> *is,
          GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
          *handler)

{
  byte *pbVar1;
  char cVar2;
  byte bVar3;
  char *pcVar4;
  byte *pbVar5;
  Ch *pCVar6;
  Ch *pCVar7;
  bool bVar8;
  bool bVar9;
  char *pcVar10;
  long lVar11;
  byte *pbVar12;
  byte *pbVar13;
  byte bVar14;
  ulong i;
  ulong uVar15;
  SizeType SVar16;
  uint i_00;
  int iVar17;
  uint uVar18;
  ulong uVar19;
  int iVar20;
  int iVar21;
  bool bVar22;
  double dVar23;
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  
  cVar2 = *is->src_;
  if (cVar2 == '\"') {
    ParseString<1u,rapidjson::GenericInsituStringStream<rapidjson::UTF8<char>>,rapidjson::GenericDocument<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,rapidjson::CrtAllocator>>
              (this,is,handler,false);
    return;
  }
  if (cVar2 == '[') {
    if (*is->src_ != '[') {
      __assert_fail("is.Peek() == \'[\'",
                    "/workspace/llm4binary/github/license_c_cmakelists/ntrrgc[P]right-window/vendor/rapidjson/reader.h"
                    ,0x327,
                    "void rapidjson::GenericReader<rapidjson::UTF8<>, rapidjson::UTF8<>>::ParseArray(InputStream &, Handler &) [SourceEncoding = rapidjson::UTF8<>, TargetEncoding = rapidjson::UTF8<>, StackAllocator = rapidjson::CrtAllocator, parseFlags = 1U, InputStream = rapidjson::GenericInsituStringStream<rapidjson::UTF8<>>, Handler = rapidjson::GenericDocument<rapidjson::UTF8<>>]"
                   );
    }
    is->src_ = is->src_ + 1;
    bVar22 = GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
             ::StartArray(handler);
    if (bVar22) {
      SkipWhitespace<rapidjson::GenericInsituStringStream<rapidjson::UTF8<char>>>(is);
      if (*(int *)(this + 0x30) != 0) {
        return;
      }
      if (*is->src_ == ']') {
        is->src_ = is->src_ + 1;
        bVar22 = GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
                 ::EndArray(handler,0);
        if (bVar22) {
          return;
        }
        if (*(int *)(this + 0x30) != 0) {
          __assert_fail("!HasParseError()",
                        "/workspace/llm4binary/github/license_c_cmakelists/ntrrgc[P]right-window/vendor/rapidjson/reader.h"
                        ,0x332,
                        "void rapidjson::GenericReader<rapidjson::UTF8<>, rapidjson::UTF8<>>::ParseArray(InputStream &, Handler &) [SourceEncoding = rapidjson::UTF8<>, TargetEncoding = rapidjson::UTF8<>, StackAllocator = rapidjson::CrtAllocator, parseFlags = 1U, InputStream = rapidjson::GenericInsituStringStream<rapidjson::UTF8<>>, Handler = rapidjson::GenericDocument<rapidjson::UTF8<>>]"
                       );
        }
      }
      else {
        SVar16 = 1;
        while( true ) {
          ParseValue<1u,rapidjson::GenericInsituStringStream<rapidjson::UTF8<char>>,rapidjson::GenericDocument<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,rapidjson::CrtAllocator>>
                    (this,is,handler);
          if (*(int *)(this + 0x30) != 0) {
            return;
          }
          SkipWhitespace<rapidjson::GenericInsituStringStream<rapidjson::UTF8<char>>>(is);
          if (*(int *)(this + 0x30) != 0) {
            return;
          }
          pcVar4 = is->src_;
          if (*pcVar4 != ',') break;
          is->src_ = pcVar4 + 1;
          SkipWhitespace<rapidjson::GenericInsituStringStream<rapidjson::UTF8<char>>>(is);
          SVar16 = SVar16 + 1;
          if (*(int *)(this + 0x30) != 0) {
            return;
          }
        }
        if (*pcVar4 != ']') {
          lVar11 = (long)pcVar4 - (long)is->head_;
          *(undefined4 *)(this + 0x30) = 7;
          goto LAB_0011c642;
        }
        is->src_ = pcVar4 + 1;
        bVar22 = GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
                 ::EndArray(handler,SVar16);
        if (bVar22) {
          return;
        }
        if (*(int *)(this + 0x30) != 0) {
          __assert_fail("!HasParseError()",
                        "/workspace/llm4binary/github/license_c_cmakelists/ntrrgc[P]right-window/vendor/rapidjson/reader.h"
                        ,0x344,
                        "void rapidjson::GenericReader<rapidjson::UTF8<>, rapidjson::UTF8<>>::ParseArray(InputStream &, Handler &) [SourceEncoding = rapidjson::UTF8<>, TargetEncoding = rapidjson::UTF8<>, StackAllocator = rapidjson::CrtAllocator, parseFlags = 1U, InputStream = rapidjson::GenericInsituStringStream<rapidjson::UTF8<>>, Handler = rapidjson::GenericDocument<rapidjson::UTF8<>>]"
                       );
        }
      }
    }
    else if (*(int *)(this + 0x30) != 0) {
      __assert_fail("!HasParseError()",
                    "/workspace/llm4binary/github/license_c_cmakelists/ntrrgc[P]right-window/vendor/rapidjson/reader.h"
                    ,0x32b,
                    "void rapidjson::GenericReader<rapidjson::UTF8<>, rapidjson::UTF8<>>::ParseArray(InputStream &, Handler &) [SourceEncoding = rapidjson::UTF8<>, TargetEncoding = rapidjson::UTF8<>, StackAllocator = rapidjson::CrtAllocator, parseFlags = 1U, InputStream = rapidjson::GenericInsituStringStream<rapidjson::UTF8<>>, Handler = rapidjson::GenericDocument<rapidjson::UTF8<>>]"
                   );
    }
    lVar11 = (long)is->src_ - (long)is->head_;
    *(undefined4 *)(this + 0x30) = 0x10;
LAB_0011c642:
    *(long *)(this + 0x38) = lVar11;
    return;
  }
  if (cVar2 == 'f') {
    pcVar4 = is->src_;
    if (*pcVar4 != 'f') {
      __assert_fail("is.Peek() == \'f\'",
                    "/workspace/llm4binary/github/license_c_cmakelists/ntrrgc[P]right-window/vendor/rapidjson/reader.h"
                    ,0x371,
                    "void rapidjson::GenericReader<rapidjson::UTF8<>, rapidjson::UTF8<>>::ParseFalse(InputStream &, Handler &) [SourceEncoding = rapidjson::UTF8<>, TargetEncoding = rapidjson::UTF8<>, StackAllocator = rapidjson::CrtAllocator, parseFlags = 1U, InputStream = rapidjson::GenericInsituStringStream<rapidjson::UTF8<>>, Handler = rapidjson::GenericDocument<rapidjson::UTF8<>>]"
                   );
    }
    pcVar10 = pcVar4 + 1;
    is->src_ = pcVar10;
    if (pcVar4[1] == 'a') {
      pcVar10 = pcVar4 + 2;
      is->src_ = pcVar10;
      if (pcVar4[2] == 'l') {
        pcVar10 = pcVar4 + 3;
        is->src_ = pcVar10;
        if (pcVar4[3] == 's') {
          pcVar10 = pcVar4 + 4;
          is->src_ = pcVar10;
          if (pcVar4[4] == 'e') {
            is->src_ = pcVar4 + 5;
            bVar22 = GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
                     ::Bool(handler,false);
            if (bVar22) {
              return;
            }
            if (*(int *)(this + 0x30) != 0) {
              __assert_fail("!HasParseError()",
                            "/workspace/llm4binary/github/license_c_cmakelists/ntrrgc[P]right-window/vendor/rapidjson/reader.h"
                            ,0x376,
                            "void rapidjson::GenericReader<rapidjson::UTF8<>, rapidjson::UTF8<>>::ParseFalse(InputStream &, Handler &) [SourceEncoding = rapidjson::UTF8<>, TargetEncoding = rapidjson::UTF8<>, StackAllocator = rapidjson::CrtAllocator, parseFlags = 1U, InputStream = rapidjson::GenericInsituStringStream<rapidjson::UTF8<>>, Handler = rapidjson::GenericDocument<rapidjson::UTF8<>>]"
                           );
            }
            lVar11 = (long)is->src_ - (long)is->head_;
            *(undefined4 *)(this + 0x30) = 0x10;
            goto LAB_0011c1ae;
          }
        }
      }
    }
    if (*(int *)(this + 0x30) != 0) {
      __assert_fail("!HasParseError()",
                    "/workspace/llm4binary/github/license_c_cmakelists/ntrrgc[P]right-window/vendor/rapidjson/reader.h"
                    ,0x379,
                    "void rapidjson::GenericReader<rapidjson::UTF8<>, rapidjson::UTF8<>>::ParseFalse(InputStream &, Handler &) [SourceEncoding = rapidjson::UTF8<>, TargetEncoding = rapidjson::UTF8<>, StackAllocator = rapidjson::CrtAllocator, parseFlags = 1U, InputStream = rapidjson::GenericInsituStringStream<rapidjson::UTF8<>>, Handler = rapidjson::GenericDocument<rapidjson::UTF8<>>]"
                   );
    }
    lVar11 = (long)pcVar10 - (long)is->head_;
    *(undefined4 *)(this + 0x30) = 3;
LAB_0011c1ae:
    *(long *)(this + 0x38) = lVar11;
    return;
  }
  if (cVar2 == '{') {
    if (*is->src_ != '{') {
      __assert_fail("is.Peek() == \'{\'",
                    "/workspace/llm4binary/github/license_c_cmakelists/ntrrgc[P]right-window/vendor/rapidjson/reader.h"
                    ,0x2e3,
                    "void rapidjson::GenericReader<rapidjson::UTF8<>, rapidjson::UTF8<>>::ParseObject(InputStream &, Handler &) [SourceEncoding = rapidjson::UTF8<>, TargetEncoding = rapidjson::UTF8<>, StackAllocator = rapidjson::CrtAllocator, parseFlags = 1U, InputStream = rapidjson::GenericInsituStringStream<rapidjson::UTF8<>>, Handler = rapidjson::GenericDocument<rapidjson::UTF8<>>]"
                   );
    }
    is->src_ = is->src_ + 1;
    bVar22 = GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
             ::StartObject(handler);
    if (bVar22) {
      SkipWhitespace<rapidjson::GenericInsituStringStream<rapidjson::UTF8<char>>>(is);
      if (*(int *)(this + 0x30) != 0) {
        return;
      }
      if (*is->src_ == '}') {
        is->src_ = is->src_ + 1;
        bVar22 = GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
                 ::EndObject(handler,0);
        if (bVar22) {
          return;
        }
        if (*(int *)(this + 0x30) != 0) {
          __assert_fail("!HasParseError()",
                        "/workspace/llm4binary/github/license_c_cmakelists/ntrrgc[P]right-window/vendor/rapidjson/reader.h"
                        ,0x2ee,
                        "void rapidjson::GenericReader<rapidjson::UTF8<>, rapidjson::UTF8<>>::ParseObject(InputStream &, Handler &) [SourceEncoding = rapidjson::UTF8<>, TargetEncoding = rapidjson::UTF8<>, StackAllocator = rapidjson::CrtAllocator, parseFlags = 1U, InputStream = rapidjson::GenericInsituStringStream<rapidjson::UTF8<>>, Handler = rapidjson::GenericDocument<rapidjson::UTF8<>>]"
                       );
        }
      }
      else {
        SVar16 = 1;
        while( true ) {
          if (*is->src_ != '\"') {
            lVar11 = (long)is->src_ - (long)is->head_;
            *(undefined4 *)(this + 0x30) = 4;
            goto LAB_0011c4a9;
          }
          ParseString<1u,rapidjson::GenericInsituStringStream<rapidjson::UTF8<char>>,rapidjson::GenericDocument<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,rapidjson::CrtAllocator>>
                    (this,is,handler,true);
          if (*(int *)(this + 0x30) != 0) {
            return;
          }
          SkipWhitespace<rapidjson::GenericInsituStringStream<rapidjson::UTF8<char>>>(is);
          if (*(int *)(this + 0x30) != 0) {
            return;
          }
          pcVar4 = is->src_;
          if (*pcVar4 != ':') {
            lVar11 = (long)pcVar4 - (long)is->head_;
            *(undefined4 *)(this + 0x30) = 5;
            goto LAB_0011c4a9;
          }
          is->src_ = pcVar4 + 1;
          SkipWhitespace<rapidjson::GenericInsituStringStream<rapidjson::UTF8<char>>>(is);
          if (*(int *)(this + 0x30) != 0) {
            return;
          }
          ParseValue<1u,rapidjson::GenericInsituStringStream<rapidjson::UTF8<char>>,rapidjson::GenericDocument<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,rapidjson::CrtAllocator>>
                    (this,is,handler);
          if (*(int *)(this + 0x30) != 0) {
            return;
          }
          SkipWhitespace<rapidjson::GenericInsituStringStream<rapidjson::UTF8<char>>>(is);
          if (*(int *)(this + 0x30) != 0) {
            return;
          }
          pcVar4 = is->src_;
          if (*pcVar4 != ',') break;
          is->src_ = pcVar4 + 1;
          SkipWhitespace<rapidjson::GenericInsituStringStream<rapidjson::UTF8<char>>>(is);
          SVar16 = SVar16 + 1;
          if (*(int *)(this + 0x30) != 0) {
            return;
          }
        }
        if (*pcVar4 != '}') {
          lVar11 = (long)pcVar4 - (long)is->head_;
          *(undefined4 *)(this + 0x30) = 6;
          goto LAB_0011c4a9;
        }
        is->src_ = pcVar4 + 1;
        bVar22 = GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
                 ::EndObject(handler,SVar16);
        if (bVar22) {
          return;
        }
        if (*(int *)(this + 0x30) != 0) {
          __assert_fail("!HasParseError()",
                        "/workspace/llm4binary/github/license_c_cmakelists/ntrrgc[P]right-window/vendor/rapidjson/reader.h"
                        ,0x313,
                        "void rapidjson::GenericReader<rapidjson::UTF8<>, rapidjson::UTF8<>>::ParseObject(InputStream &, Handler &) [SourceEncoding = rapidjson::UTF8<>, TargetEncoding = rapidjson::UTF8<>, StackAllocator = rapidjson::CrtAllocator, parseFlags = 1U, InputStream = rapidjson::GenericInsituStringStream<rapidjson::UTF8<>>, Handler = rapidjson::GenericDocument<rapidjson::UTF8<>>]"
                       );
        }
      }
    }
    else if (*(int *)(this + 0x30) != 0) {
      __assert_fail("!HasParseError()",
                    "/workspace/llm4binary/github/license_c_cmakelists/ntrrgc[P]right-window/vendor/rapidjson/reader.h"
                    ,0x2e7,
                    "void rapidjson::GenericReader<rapidjson::UTF8<>, rapidjson::UTF8<>>::ParseObject(InputStream &, Handler &) [SourceEncoding = rapidjson::UTF8<>, TargetEncoding = rapidjson::UTF8<>, StackAllocator = rapidjson::CrtAllocator, parseFlags = 1U, InputStream = rapidjson::GenericInsituStringStream<rapidjson::UTF8<>>, Handler = rapidjson::GenericDocument<rapidjson::UTF8<>>]"
                   );
    }
    lVar11 = (long)is->src_ - (long)is->head_;
    *(undefined4 *)(this + 0x30) = 0x10;
LAB_0011c4a9:
    *(long *)(this + 0x38) = lVar11;
    return;
  }
  if (cVar2 == 't') {
    pcVar4 = is->src_;
    if (*pcVar4 != 't') {
      __assert_fail("is.Peek() == \'t\'",
                    "/workspace/llm4binary/github/license_c_cmakelists/ntrrgc[P]right-window/vendor/rapidjson/reader.h"
                    ,0x364,
                    "void rapidjson::GenericReader<rapidjson::UTF8<>, rapidjson::UTF8<>>::ParseTrue(InputStream &, Handler &) [SourceEncoding = rapidjson::UTF8<>, TargetEncoding = rapidjson::UTF8<>, StackAllocator = rapidjson::CrtAllocator, parseFlags = 1U, InputStream = rapidjson::GenericInsituStringStream<rapidjson::UTF8<>>, Handler = rapidjson::GenericDocument<rapidjson::UTF8<>>]"
                   );
    }
    pcVar10 = pcVar4 + 1;
    is->src_ = pcVar10;
    if (pcVar4[1] == 'r') {
      pcVar10 = pcVar4 + 2;
      is->src_ = pcVar10;
      if (pcVar4[2] == 'u') {
        pcVar10 = pcVar4 + 3;
        is->src_ = pcVar10;
        if (pcVar4[3] == 'e') {
          is->src_ = pcVar4 + 4;
          bVar22 = GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
                   ::Bool(handler,true);
          if (bVar22) {
            return;
          }
          if (*(int *)(this + 0x30) != 0) {
            __assert_fail("!HasParseError()",
                          "/workspace/llm4binary/github/license_c_cmakelists/ntrrgc[P]right-window/vendor/rapidjson/reader.h"
                          ,0x369,
                          "void rapidjson::GenericReader<rapidjson::UTF8<>, rapidjson::UTF8<>>::ParseTrue(InputStream &, Handler &) [SourceEncoding = rapidjson::UTF8<>, TargetEncoding = rapidjson::UTF8<>, StackAllocator = rapidjson::CrtAllocator, parseFlags = 1U, InputStream = rapidjson::GenericInsituStringStream<rapidjson::UTF8<>>, Handler = rapidjson::GenericDocument<rapidjson::UTF8<>>]"
                         );
          }
          lVar11 = (long)is->src_ - (long)is->head_;
          *(undefined4 *)(this + 0x30) = 0x10;
          goto LAB_0011c0d2;
        }
      }
    }
    if (*(int *)(this + 0x30) != 0) {
      __assert_fail("!HasParseError()",
                    "/workspace/llm4binary/github/license_c_cmakelists/ntrrgc[P]right-window/vendor/rapidjson/reader.h"
                    ,0x36c,
                    "void rapidjson::GenericReader<rapidjson::UTF8<>, rapidjson::UTF8<>>::ParseTrue(InputStream &, Handler &) [SourceEncoding = rapidjson::UTF8<>, TargetEncoding = rapidjson::UTF8<>, StackAllocator = rapidjson::CrtAllocator, parseFlags = 1U, InputStream = rapidjson::GenericInsituStringStream<rapidjson::UTF8<>>, Handler = rapidjson::GenericDocument<rapidjson::UTF8<>>]"
                   );
    }
    lVar11 = (long)pcVar10 - (long)is->head_;
    *(undefined4 *)(this + 0x30) = 3;
LAB_0011c0d2:
    *(long *)(this + 0x38) = lVar11;
    return;
  }
  if (cVar2 == 'n') {
    ParseNull<1u,rapidjson::GenericInsituStringStream<rapidjson::UTF8<char>>,rapidjson::GenericDocument<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,rapidjson::CrtAllocator>>
              (this,is,handler);
    return;
  }
  pbVar5 = (byte *)is->src_;
  bVar3 = *pbVar5;
  pbVar13 = pbVar5;
  bVar14 = bVar3;
  if (bVar3 == 0x2d) {
    pbVar13 = pbVar5 + 1;
    bVar14 = pbVar5[1];
  }
  pCVar6 = is->dst_;
  pCVar7 = is->head_;
  if (bVar14 == 0x30) {
    uVar18 = (uint)pbVar13[1];
    pbVar12 = pbVar13 + 1;
    dVar23 = 0.0;
    bVar22 = false;
    i = 0;
    bVar9 = false;
    uVar15 = 0;
    bVar8 = false;
    i_00 = 0;
LAB_0011c8e5:
    if ((char)uVar18 == '.') {
      uVar18 = (uint)pbVar12[1];
      pbVar13 = pbVar12 + 1;
      if ((byte)(pbVar12[1] - 0x3a) < 0xf6) {
        if (*(int *)(this + 0x30) != 0) {
          __assert_fail("!HasParseError()",
                        "/workspace/llm4binary/github/license_c_cmakelists/ntrrgc[P]right-window/vendor/rapidjson/reader.h"
                        ,0x627,
                        "void rapidjson::GenericReader<rapidjson::UTF8<>, rapidjson::UTF8<>>::ParseNumber(InputStream &, Handler &) [SourceEncoding = rapidjson::UTF8<>, TargetEncoding = rapidjson::UTF8<>, StackAllocator = rapidjson::CrtAllocator, parseFlags = 1U, InputStream = rapidjson::GenericInsituStringStream<rapidjson::UTF8<>>, Handler = rapidjson::GenericDocument<rapidjson::UTF8<>>]"
                       );
        }
        *(undefined4 *)(this + 0x30) = 0xe;
        pbVar12 = pbVar13;
      }
      else {
        iVar20 = 0;
        pbVar12 = pbVar13;
        if (!bVar22) {
          if (!bVar8) {
            i = (ulong)i_00;
          }
          iVar20 = 0;
          while ((('/' < (char)(byte)uVar18 && ((byte)uVar18 < 0x3a)) && (i >> 0x35 == 0))) {
            pbVar12 = pbVar13 + 1;
            pbVar13 = pbVar13 + 1;
            iVar20 = iVar20 + -1;
            i = (ulong)(uVar18 - 0x30) + i * 10;
            uVar15 = (ulong)((int)uVar15 + (uint)(i != 0));
            uVar18 = (uint)*pbVar12;
          }
          auVar25._8_4_ = (int)(i >> 0x20);
          auVar25._0_8_ = i;
          auVar25._12_4_ = 0x45300000;
          dVar23 = (auVar25._8_8_ - 1.9342813113834067e+25) +
                   ((double)CONCAT44(0x43300000,(int)i) - 4503599627370496.0);
          bVar9 = true;
          pbVar12 = pbVar13;
        }
        while ('/' < (char)(byte)uVar18) {
          if (0x39 < (byte)uVar18) goto LAB_0011ca2a;
          if ((int)uVar15 < 0x11) {
            dVar23 = dVar23 * 10.0 + (double)(int)(uVar18 - 0x30);
            iVar20 = iVar20 + -1;
            if (0.0 < dVar23) {
              uVar15 = (ulong)((int)uVar15 + 1);
            }
          }
          uVar18 = (uint)pbVar12[1];
          pbVar12 = pbVar12 + 1;
        }
        iVar17 = 0;
LAB_0011cb5a:
        if (bVar9) {
          dVar23 = internal::StrtodNormalPrecision(dVar23,iVar17 + iVar20);
          if (1.79769313486232e+308 < dVar23) {
            if (*(int *)(this + 0x30) != 0) {
              __assert_fail("!HasParseError()",
                            "/workspace/llm4binary/github/license_c_cmakelists/ntrrgc[P]right-window/vendor/rapidjson/reader.h"
                            ,0x6ab,
                            "void rapidjson::GenericReader<rapidjson::UTF8<>, rapidjson::UTF8<>>::ParseNumber(InputStream &, Handler &) [SourceEncoding = rapidjson::UTF8<>, TargetEncoding = rapidjson::UTF8<>, StackAllocator = rapidjson::CrtAllocator, parseFlags = 1U, InputStream = rapidjson::GenericInsituStringStream<rapidjson::UTF8<>>, Handler = rapidjson::GenericDocument<rapidjson::UTF8<>>]"
                           );
            }
            goto LAB_0011cb7f;
          }
          if (bVar3 == 0x2d) {
            dVar23 = -dVar23;
          }
          bVar22 = GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
                   ::Double(handler,dVar23);
        }
        else if (bVar8) {
          if (bVar3 == 0x2d) {
            bVar22 = GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
                     ::Int64(handler,-i);
          }
          else {
            bVar22 = GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
                     ::Uint64(handler,i);
          }
        }
        else if (bVar3 == 0x2d) {
          bVar22 = GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
                   ::Int(handler,-i_00);
        }
        else {
          bVar22 = GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
                   ::Uint(handler,i_00);
        }
        if (bVar22 != false) goto LAB_0011cc18;
        if (*(int *)(this + 0x30) != 0) {
          __assert_fail("!HasParseError()",
                        "/workspace/llm4binary/github/license_c_cmakelists/ntrrgc[P]right-window/vendor/rapidjson/reader.h"
                        ,0x6c3,
                        "void rapidjson::GenericReader<rapidjson::UTF8<>, rapidjson::UTF8<>>::ParseNumber(InputStream &, Handler &) [SourceEncoding = rapidjson::UTF8<>, TargetEncoding = rapidjson::UTF8<>, StackAllocator = rapidjson::CrtAllocator, parseFlags = 1U, InputStream = rapidjson::GenericInsituStringStream<rapidjson::UTF8<>>, Handler = rapidjson::GenericDocument<rapidjson::UTF8<>>]"
                       );
        }
        *(undefined4 *)(this + 0x30) = 0x10;
        pbVar13 = pbVar5;
      }
    }
    else {
      iVar20 = 0;
LAB_0011ca2a:
      iVar17 = 0;
      if ((uVar18 | 0x20) != 0x65) goto LAB_0011cb5a;
      uVar15 = (ulong)i_00;
      if (bVar8) {
        uVar15 = i;
      }
      if (!bVar9) {
        auVar26._8_4_ = (int)(uVar15 >> 0x20);
        auVar26._0_8_ = uVar15;
        auVar26._12_4_ = 0x45300000;
        dVar23 = (auVar26._8_8_ - 1.9342813113834067e+25) +
                 ((double)CONCAT44(0x43300000,(int)uVar15) - 4503599627370496.0);
        bVar9 = true;
      }
      bVar14 = pbVar12[1];
      bVar22 = bVar14 != 0x2b;
      if ((bVar22) && (bVar14 != 0x2d)) {
        pbVar13 = pbVar12 + 1;
        bVar22 = false;
      }
      else {
        bVar14 = pbVar12[2];
        pbVar13 = pbVar12 + 2;
      }
      if (9 < (byte)(bVar14 - 0x30)) {
        if (*(int *)(this + 0x30) != 0) {
          __assert_fail("!HasParseError()",
                        "/workspace/llm4binary/github/license_c_cmakelists/ntrrgc[P]right-window/vendor/rapidjson/reader.h"
                        ,0x67c,
                        "void rapidjson::GenericReader<rapidjson::UTF8<>, rapidjson::UTF8<>>::ParseNumber(InputStream &, Handler &) [SourceEncoding = rapidjson::UTF8<>, TargetEncoding = rapidjson::UTF8<>, StackAllocator = rapidjson::CrtAllocator, parseFlags = 1U, InputStream = rapidjson::GenericInsituStringStream<rapidjson::UTF8<>>, Handler = rapidjson::GenericDocument<rapidjson::UTF8<>>]"
                       );
        }
        *(undefined4 *)(this + 0x30) = 0xf;
        pbVar12 = pbVar13;
        goto LAB_0011cb89;
      }
      pbVar12 = pbVar13 + 1;
      iVar21 = bVar14 - 0x30;
      if (bVar22) {
        if (0 < iVar20) {
          __assert_fail("expFrac <= 0",
                        "/workspace/llm4binary/github/license_c_cmakelists/ntrrgc[P]right-window/vendor/rapidjson/reader.h"
                        ,0x667,
                        "void rapidjson::GenericReader<rapidjson::UTF8<>, rapidjson::UTF8<>>::ParseNumber(InputStream &, Handler &) [SourceEncoding = rapidjson::UTF8<>, TargetEncoding = rapidjson::UTF8<>, StackAllocator = rapidjson::CrtAllocator, parseFlags = 1U, InputStream = rapidjson::GenericInsituStringStream<rapidjson::UTF8<>>, Handler = rapidjson::GenericDocument<rapidjson::UTF8<>>]"
                       );
        }
        pbVar13 = pbVar12;
        while (pbVar12 = pbVar13, (byte)(*pbVar12 - 0x30) < 10) {
          iVar21 = iVar21 * 10 + (uint)*pbVar12 + -0x30;
          pbVar13 = pbVar12 + 1;
          if ((iVar20 + 0x7ffffff7) / 10 < iVar21) {
            do {
              pbVar1 = pbVar12 + 1;
              pbVar12 = pbVar12 + 1;
              pbVar13 = pbVar12;
            } while ((byte)(*pbVar1 - 0x30) < 10);
          }
        }
LAB_0011cb4e:
        iVar17 = -iVar21;
        if (!bVar22) {
          iVar17 = iVar21;
        }
        goto LAB_0011cb5a;
      }
      do {
        bVar14 = *pbVar12;
        if (9 < (byte)(bVar14 - 0x30)) goto LAB_0011cb4e;
        pbVar12 = pbVar12 + 1;
        iVar21 = iVar21 * 10 + (uint)bVar14 + -0x30;
      } while (iVar21 <= 0x134 - iVar20);
      if (*(int *)(this + 0x30) != 0) {
        __assert_fail("!HasParseError()",
                      "/workspace/llm4binary/github/license_c_cmakelists/ntrrgc[P]right-window/vendor/rapidjson/reader.h"
                      ,0x677,
                      "void rapidjson::GenericReader<rapidjson::UTF8<>, rapidjson::UTF8<>>::ParseNumber(InputStream &, Handler &) [SourceEncoding = rapidjson::UTF8<>, TargetEncoding = rapidjson::UTF8<>, StackAllocator = rapidjson::CrtAllocator, parseFlags = 1U, InputStream = rapidjson::GenericInsituStringStream<rapidjson::UTF8<>>, Handler = rapidjson::GenericDocument<rapidjson::UTF8<>>]"
                     );
      }
LAB_0011cb7f:
      *(undefined4 *)(this + 0x30) = 0xd;
      pbVar13 = pbVar5;
    }
  }
  else {
    if ((byte)(bVar14 - 0x31) < 9) {
      i_00 = bVar14 - 0x30;
      uVar15 = 0;
      if (bVar3 == 0x2d) {
LAB_0011c742:
        bVar14 = pbVar13[uVar15 + 1];
        uVar19 = (ulong)bVar14;
        if (9 < (byte)(bVar14 - 0x30)) goto LAB_0011c81a;
        if (i_00 < 0xccccccc) {
LAB_0011c75b:
          i_00 = (i_00 * 10 + (uint)bVar14) - 0x30;
          uVar15 = uVar15 + 1;
          goto LAB_0011c742;
        }
        uVar18 = i_00;
        if (i_00 != 0xccccccc) goto LAB_0011c7c1;
        if (bVar14 < 0x39) goto LAB_0011c75b;
        uVar19 = 0x39;
        uVar18 = 0xccccccc;
LAB_0011c7c1:
        i_00 = uVar18;
        pbVar12 = pbVar13 + uVar15 + 1;
        i = (ulong)i_00;
        if (bVar3 == 0x2d) {
          while( true ) {
            uVar18 = (uint)uVar19;
            if (9 < (byte)((byte)uVar19 - 0x30)) break;
            if ((0xccccccccccccccb < i) && (0x38 < (byte)uVar19 || i != 0xccccccccccccccc))
            goto LAB_0011c87f;
            i = (uVar19 & 0xf) + i * 10;
            uVar15 = (ulong)((int)uVar15 + 1);
            uVar19 = (ulong)pbVar12[1];
            pbVar12 = pbVar12 + 1;
          }
        }
        else {
          while( true ) {
            uVar18 = (uint)uVar19;
            if (9 < (byte)((byte)uVar19 - 0x30)) break;
            if ((0x1999999999999998 < i) && (0x35 < (byte)uVar19 || i != 0x1999999999999999))
            goto LAB_0011c87f;
            i = (uVar19 & 0xf) + i * 10;
            uVar15 = (ulong)((int)uVar15 + 1);
            uVar19 = (ulong)pbVar12[1];
            pbVar12 = pbVar12 + 1;
          }
        }
        dVar23 = 0.0;
        bVar8 = true;
        bVar22 = false;
        bVar9 = false;
      }
      else {
        while( true ) {
          bVar14 = pbVar13[uVar15 + 1];
          uVar19 = (ulong)bVar14;
          if (9 < (byte)(bVar14 - 0x30)) break;
          if ((0x19999998 < i_00) &&
             ((uVar18 = i_00, i_00 != 0x19999999 || (uVar18 = 0x19999999, 0x35 < bVar14))))
          goto LAB_0011c7c1;
          i_00 = (i_00 * 10 + (uint)bVar14) - 0x30;
          uVar15 = uVar15 + 1;
        }
LAB_0011c81a:
        uVar18 = (uint)bVar14;
        pbVar12 = pbVar13 + uVar15 + 1;
        dVar23 = 0.0;
        bVar22 = false;
        i = 0;
        bVar9 = false;
        bVar8 = false;
      }
      goto LAB_0011c8e5;
    }
    if (*(int *)(this + 0x30) != 0) {
      __assert_fail("!HasParseError()",
                    "/workspace/llm4binary/github/license_c_cmakelists/ntrrgc[P]right-window/vendor/rapidjson/reader.h"
                    ,0x5fc,
                    "void rapidjson::GenericReader<rapidjson::UTF8<>, rapidjson::UTF8<>>::ParseNumber(InputStream &, Handler &) [SourceEncoding = rapidjson::UTF8<>, TargetEncoding = rapidjson::UTF8<>, StackAllocator = rapidjson::CrtAllocator, parseFlags = 1U, InputStream = rapidjson::GenericInsituStringStream<rapidjson::UTF8<>>, Handler = rapidjson::GenericDocument<rapidjson::UTF8<>>]"
                   );
    }
    *(undefined4 *)(this + 0x30) = 3;
    pbVar12 = pbVar13;
  }
LAB_0011cb89:
  *(long *)(this + 0x38) = (long)pbVar13 - (long)pCVar7;
LAB_0011cc18:
  is->src_ = (Ch *)pbVar12;
  is->dst_ = pCVar6;
  is->head_ = pCVar7;
  return;
LAB_0011c87f:
  auVar24._8_4_ = (int)(i >> 0x20);
  auVar24._0_8_ = i;
  auVar24._12_4_ = 0x45300000;
  dVar23 = (auVar24._8_8_ - 1.9342813113834067e+25) +
           ((double)CONCAT44(0x43300000,(int)i) - 4503599627370496.0);
  while (uVar18 = (uint)uVar19, (byte)((char)uVar19 - 0x30U) < 10) {
    dVar23 = dVar23 * 10.0 + (double)(int)(uVar18 - 0x30);
    pbVar13 = pbVar12 + 1;
    pbVar12 = pbVar12 + 1;
    uVar19 = (ulong)*pbVar13;
  }
  bVar22 = true;
  bVar9 = true;
  bVar8 = true;
  goto LAB_0011c8e5;
}

Assistant:

Ch Peek() { return *src_; }